

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O1

bool __thiscall BoardIO::WriteIPv4Address(BoardIO *this,uint32_t IPaddr)

{
  BasePort *pBVar1;
  int iVar2;
  
  pBVar1 = this->port;
  if (((pBVar1 == (BasePort *)0x0) || (0xf < (ulong)this->BoardId)) ||
     ((uint)pBVar1->FirmwareVersion[this->BoardId] < 7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BoardIO::WriteIPv4Address: requires firmware 7 or above",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  else if (pBVar1 != (BasePort *)0x0) {
    iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)this->BoardId,0xb,IPaddr);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool BoardIO::WriteIPv4Address(uint32_t IPaddr)
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "BoardIO::WriteIPv4Address: requires firmware 7 or above" << std::endl;
        return false;
    }
    return (port ? port->WriteQuadlet(BoardId, BoardIO::IP_ADDR, IPaddr) : false);
}